

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialnonce.cpp
# Opt level: O2

void __thiscall
ConfidentialNonce_Constractor_Test::TestBody(ConfidentialNonce_Constractor_Test *this)

{
  char *pcVar1;
  char *in_R9;
  AssertHelper local_78;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  AssertHelper local_40;
  ConfidentialNonce nonce;
  
  cfd::core::ConfidentialNonce::ConfidentialNonce(&nonce);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_((string *)&gtest_ar_2,&nonce);
  pcVar1 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"nonce.GetHex().c_str()","\"\"",
             (char *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_),"");
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialnonce.cpp"
               ,0x13,pcVar1);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ConfidentialNonce::GetData((ByteData *)&gtest_ar_2,&nonce);
  local_78.data_ = (AssertHelperData *)cfd::core::ByteData::GetDataSize((ByteData *)&gtest_ar_2);
  local_40.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"nonce.GetData().GetDataSize()","0",(unsigned_long *)&local_78,
             (int *)&local_40);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialnonce.cpp"
               ,0x14,pcVar1);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.success_ = cfd::core::ConfidentialNonce::HasBlinding(&nonce);
  local_78.data_ = local_78.data_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_2,"nonce.HasBlinding()","false",&gtest_ar.success_,
             (bool *)&local_78);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialnonce.cpp"
               ,0x15,pcVar1);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  gtest_ar.success_ = cfd::core::ConfidentialNonce::IsEmpty(&nonce);
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar.success_) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2,(internal *)&gtest_ar,(AssertionResult *)"nonce.IsEmpty()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialnonce.cpp"
               ,0x16,(char *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    std::__cxx11::string::~string((string *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&nonce);
  return;
}

Assistant:

TEST(ConfidentialNonce, Constractor) {
  ConfidentialNonce nonce;

  EXPECT_STREQ(nonce.GetHex().c_str(), "");
  EXPECT_EQ(nonce.GetData().GetDataSize(), 0);
  EXPECT_EQ(nonce.HasBlinding(), false);
  EXPECT_TRUE(nonce.IsEmpty());
}